

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O3

zlib_table * zlib_mkonetab(int *codes,uchar *lengths,int nsyms,int pfx,int pfxbits,int bits)

{
  byte bVar1;
  zlib_table *pzVar2;
  zlib_tableentry *pzVar3;
  zlib_table *pzVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  
  bVar1 = (byte)bits;
  lVar10 = 0;
  pzVar2 = (zlib_table *)safemalloc(1,0x10,0);
  bVar5 = (byte)pfxbits;
  pzVar3 = (zlib_tableentry *)safemalloc(1L << (bVar1 & 0x3f),0x10,0);
  pzVar2->table = pzVar3;
  uVar9 = -1 << (bVar1 & 0x1f);
  uVar7 = ~uVar9;
  pzVar2->mask = uVar7;
  do {
    *(undefined2 *)((long)&pzVar3->code + lVar10) = 0xffff;
    (&pzVar3->nbits)[lVar10] = '\0';
    *(undefined8 *)((long)&pzVar3->nexttable + lVar10) = 0;
    lVar10 = lVar10 + 0x10;
  } while ((ulong)-uVar9 << 4 != lVar10);
  if (0 < nsyms) {
    uVar8 = 0;
    do {
      if ((pfxbits < (int)(uint)lengths[uVar8]) && ((codes[uVar8] & ~(-1 << (bVar5 & 0x1f))) == pfx)
         ) {
        uVar9 = codes[uVar8] >> (bVar5 & 0x1f) & uVar7;
        do {
          pzVar3[(int)uVar9].code = (short)uVar8;
          iVar6 = (uint)lengths[uVar8] - pfxbits;
          if ((int)(uint)pzVar3[(int)uVar9].nbits < iVar6) {
            pzVar3[(int)uVar9].nbits = (uchar)iVar6;
            iVar6 = (uint)lengths[uVar8] - pfxbits;
          }
          uVar9 = uVar9 + (1 << ((byte)iVar6 & 0x1f));
        } while ((int)uVar9 <= (int)uVar7);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nsyms);
  }
  lVar10 = -1;
  lVar11 = 0;
  do {
    iVar6 = (uint)(&pzVar3->nbits)[lVar11] - bits;
    if (iVar6 != 0 && bits <= (int)(uint)(&pzVar3->nbits)[lVar11]) {
      if (6 < iVar6) {
        iVar6 = 7;
      }
      *(undefined2 *)((long)&pzVar3->code + lVar11) = 0xffff;
      (&pzVar3->nbits)[lVar11] = bVar1;
      pzVar4 = zlib_mkonetab(codes,lengths,nsyms,(int)lVar10 + 1 << (bVar5 & 0x1f) | pfx,
                             bits + pfxbits,iVar6);
      pzVar3 = pzVar2->table;
      *(zlib_table **)((long)&pzVar3->nexttable + lVar11) = pzVar4;
      uVar7 = pzVar2->mask;
    }
    lVar10 = lVar10 + 1;
    lVar11 = lVar11 + 0x10;
  } while (lVar10 < (int)uVar7);
  return pzVar2;
}

Assistant:

static struct zlib_table *zlib_mkonetab(int *codes, unsigned char *lengths,
                                        int nsyms,
                                        int pfx, int pfxbits, int bits)
{
    struct zlib_table *tab = snew(struct zlib_table);
    int pfxmask = (1 << pfxbits) - 1;
    int nbits, i, j, code;

    tab->table = snewn((size_t)1 << bits, struct zlib_tableentry);
    tab->mask = (1 << bits) - 1;

    for (code = 0; code <= tab->mask; code++) {
        tab->table[code].code = -1;
        tab->table[code].nbits = 0;
        tab->table[code].nexttable = NULL;
    }

    for (i = 0; i < nsyms; i++) {
        if (lengths[i] <= pfxbits || (codes[i] & pfxmask) != pfx)
            continue;
        code = (codes[i] >> pfxbits) & tab->mask;
        for (j = code; j <= tab->mask; j += 1 << (lengths[i] - pfxbits)) {
            tab->table[j].code = i;
            nbits = lengths[i] - pfxbits;
            if (tab->table[j].nbits < nbits)
                tab->table[j].nbits = nbits;
        }
    }
    for (code = 0; code <= tab->mask; code++) {
        if (tab->table[code].nbits <= bits)
            continue;
        /* Generate a subtable. */
        tab->table[code].code = -1;
        nbits = tab->table[code].nbits - bits;
        if (nbits > 7)
            nbits = 7;
        tab->table[code].nbits = bits;
        tab->table[code].nexttable = zlib_mkonetab(codes, lengths, nsyms,
                                                   pfx | (code << pfxbits),
                                                   pfxbits + bits, nbits);
    }

    return tab;
}